

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

uint32_t helper_mvcl(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  _Bool _Var1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint64_t dest;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uintptr_t unaff_retaddr;
  ulong local_e0;
  int local_d4;
  ulong local_d0;
  uint64_t *local_c8;
  uint32_t local_bc;
  uint64_t *local_98;
  S390Access local_80;
  S390Access local_58;
  
  uVar9 = (env->psw).mask;
  local_d4 = 3;
  if ((uVar9 >> 0x3a & 1) != 0) {
    switch((uint)(uVar9 >> 0x2e) & 3) {
    case 0:
      local_d4 = 0;
      break;
    case 1:
      abort();
    case 2:
      local_d4 = 1;
      break;
    case 3:
      local_d4 = 2;
    }
  }
  uVar2 = r1 + 1;
  uVar6 = (uint)env->regs[uVar2] & 0xffffff;
  uVar7 = (ulong)uVar6;
  dest = env->regs[(int)r1];
  iVar8 = (int)uVar9;
  if ((uVar9 >> 0x20 & 1) == 0) {
    uVar4 = 0x7fffffff;
    if (-1 < iVar8) {
      uVar4 = 0xffffff;
    }
    dest = (uint64_t)((uint)dest & uVar4);
    local_98 = env->regs + (r2 + 1);
    uVar4 = (uint)*local_98;
    local_c8 = env->regs + (int)r2;
    local_d0 = *local_c8;
    if (iVar8 < 0) {
      local_e0 = (ulong)((uint)local_d0 & 0x7fffffff);
    }
    else {
      local_e0 = (ulong)((uint)local_d0 & 0xffffff);
    }
  }
  else {
    local_98 = env->regs + (r2 + 1);
    uVar4 = (uint)*local_98;
    local_c8 = env->regs + (int)r2;
    local_e0 = *local_c8;
    local_d0 = local_e0;
  }
  uVar10 = (ulong)(uVar4 & 0xffffff);
  if (uVar10 < uVar7) {
    uVar6 = uVar4 & 0xffffff;
  }
  _Var1 = is_destructive_overlap(env,dest,local_e0,uVar6);
  local_bc = 3;
  if (!_Var1) {
    local_bc = 0;
    if (uVar10 != uVar7) {
      local_bc = 2 - (uVar7 < uVar10);
    }
    if (uVar7 != 0) {
      if (uVar10 == 0) {
        uVar5 = local_e0;
        if ((uVar9 & 0x100000000) == 0) {
          uVar6 = 0x7fffffff;
          if (-1 < iVar8) {
            uVar6 = 0xffffff;
          }
          uVar5 = local_d0 & 0xffffffff00000000 | (ulong)(uVar6 & (uint)local_e0);
        }
        *local_c8 = uVar5;
      }
      while( true ) {
        uVar9 = -(dest | 0xfffffffffffff000);
        if (uVar7 < -(dest | 0xfffffffffffff000)) {
          uVar9 = uVar7;
        }
        if (uVar10 == 0) {
          access_prepare(&local_80,env,dest,(int)uVar9,MMU_DATA_STORE,local_d4,unaff_retaddr);
          access_memset(env,&local_80,(uint8_t)(uVar4 >> 0x18),unaff_retaddr);
          uVar10 = 0;
        }
        else {
          uVar3 = -(local_e0 | 0xfffffffffffff000);
          if (uVar10 < -(local_e0 | 0xfffffffffffff000)) {
            uVar3 = uVar10;
          }
          if (uVar3 < uVar9) {
            uVar9 = uVar3;
          }
          access_prepare(&local_58,env,local_e0,(int)uVar9,MMU_DATA_LOAD,local_d4,unaff_retaddr);
          access_prepare(&local_80,env,dest,(int)uVar9,MMU_DATA_STORE,local_d4,unaff_retaddr);
          access_memmove(env,&local_80,&local_58,unaff_retaddr);
          local_e0 = local_e0 + uVar9;
          uVar3 = (env->psw).mask;
          if ((uVar3 & 0x100000000) == 0) {
            if ((int)uVar3 < 0) {
              uVar6 = (uint)local_e0 & 0x7fffffff;
            }
            else {
              uVar6 = (uint)local_e0 & 0xffffff;
            }
            local_e0 = (ulong)uVar6;
          }
          uVar10 = uVar10 - uVar9;
          *local_98 = (ulong)((uint)uVar10 & 0xffffff) | *local_98 & 0xffffffffff000000;
          uVar3 = (env->psw).mask;
          if ((uVar3 & 0x100000000) == 0) {
            uVar6 = 0x7fffffff;
            if (-1 < (int)uVar3) {
              uVar6 = 0xffffff;
            }
            *local_c8 = *local_c8 & 0xffffffff00000000 | (ulong)((uint)local_e0 & uVar6);
          }
          else {
            *local_c8 = local_e0;
          }
        }
        dest = dest + uVar9;
        uVar3 = (env->psw).mask;
        if ((uVar3 & 0x100000000) == 0) {
          if ((int)uVar3 < 0) {
            dest = (uint64_t)((uint)dest & 0x7fffffff);
          }
          else {
            dest = (uint64_t)((uint)dest & 0xffffff);
          }
        }
        uVar7 = uVar7 - uVar9;
        env->regs[uVar2] = (ulong)((uint)uVar7 & 0xffffff) | env->regs[uVar2] & 0xffffffffff000000;
        uVar9 = (env->psw).mask;
        uVar3 = dest;
        if ((uVar9 & 0x100000000) == 0) {
          uVar6 = 0x7fffffff;
          if (-1 < (int)uVar9) {
            uVar6 = 0xffffff;
          }
          uVar3 = env->regs[(int)r1] & 0xffffffff00000000 | (ulong)((uint)dest & uVar6);
        }
        env->regs[(int)r1] = uVar3;
        if (uVar7 == 0) break;
        iVar8._0_1_ = env[-1].cpu_state;
        iVar8._1_1_ = env[-1].sigp_order;
        iVar8._2_2_ = *(undefined2 *)&env[-1].field_0x4b2;
        if (iVar8 < 0) {
          cpu_loop_exit_restore_s390x((CPUState *)(env[-0x1e].vregs + 0xf),unaff_retaddr);
        }
      }
      return local_bc;
    }
  }
  if ((uVar9 & 0x100000000) == 0) {
    uVar6 = 0x7fffffff;
    if (-1 < iVar8) {
      uVar6 = 0xffffff;
    }
    local_e0 = (ulong)((uint)local_e0 & uVar6) | local_d0 & 0xffffffff00000000;
  }
  *local_c8 = local_e0;
  uVar9 = (env->psw).mask;
  if ((uVar9 & 0x100000000) == 0) {
    uVar6 = 0x7fffffff;
    if (-1 < (int)uVar9) {
      uVar6 = 0xffffff;
    }
    dest = (ulong)((uint)dest & uVar6) | env->regs[(int)r1] & 0xffffffff00000000;
  }
  env->regs[(int)r1] = dest;
  return local_bc;
}

Assistant:

uint32_t HELPER(mvcl)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    uintptr_t ra = GETPC();
    uint64_t destlen = env->regs[r1 + 1] & 0xffffff;
    uint64_t dest = get_address(env, r1);
    uint64_t srclen = env->regs[r2 + 1] & 0xffffff;
    uint64_t src = get_address(env, r2);
    uint8_t pad = env->regs[r2 + 1] >> 24;
    CPUState *cs = env_cpu(env);
    S390Access srca, desta;
    uint32_t cc, cur_len;

    if (is_destructive_overlap(env, dest, src, MIN(srclen, destlen))) {
        cc = 3;
    } else if (srclen == destlen) {
        cc = 0;
    } else if (destlen < srclen) {
        cc = 1;
    } else {
        cc = 2;
    }

    /* We might have to zero-out some bits even if there was no action. */
    if (unlikely(!destlen || cc == 3)) {
        set_address_zero(env, r2, src);
        set_address_zero(env, r1, dest);
        return cc;
    } else if (!srclen) {
        set_address_zero(env, r2, src);
    }

    /*
     * Only perform one type of type of operation (move/pad) in one step.
     * Stay within single pages.
     */
    while (destlen) {
        cur_len = MIN(destlen, -(dest | TARGET_PAGE_MASK));
        if (!srclen) {
            desta = access_prepare(env, dest, cur_len, MMU_DATA_STORE, mmu_idx,
                                   ra);
            access_memset(env, &desta, pad, ra);
        } else {
            cur_len = MIN(MIN(srclen, -(src | TARGET_PAGE_MASK)), cur_len);

            srca = access_prepare(env, src, cur_len, MMU_DATA_LOAD, mmu_idx,
                                  ra);
            desta = access_prepare(env, dest, cur_len, MMU_DATA_STORE, mmu_idx,
                                   ra);
            access_memmove(env, &desta, &srca, ra);
            src = wrap_address(env, src + cur_len);
            srclen -= cur_len;
            env->regs[r2 + 1] = deposit64(env->regs[r2 + 1], 0, 24, srclen);
            set_address_zero(env, r2, src);
        }
        dest = wrap_address(env, dest + cur_len);
        destlen -= cur_len;
        env->regs[r1 + 1] = deposit64(env->regs[r1 + 1], 0, 24, destlen);
        set_address_zero(env, r1, dest);

        /*
         * MVCL is interruptible. Return to the main loop if requested after
         * writing back all state to registers. If no interrupt will get
         * injected, we'll end up back in this handler and continue processing
         * the remaining parts.
         */
        if (destlen && unlikely(cpu_loop_exit_requested(cs))) {
            cpu_loop_exit_restore(cs, ra);
        }
    }
    return cc;
}